

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall
btBridgedManifoldResult::addContactPoint
          (btBridgedManifoldResult *this,btVector3 *normalOnBInWorld,btVector3 *pointInWorld,
          btScalar depth)

{
  btCollisionObject *pbVar1;
  btCollisionObject *pbVar2;
  btCollisionObjectWrapper *pbVar3;
  btCollisionObjectWrapper *pbVar4;
  long lVar5;
  btCollisionObjectWrapper *pbVar6;
  btCollisionObjectWrapper **ppbVar7;
  btScalar bVar8;
  btScalar bVar9;
  undefined8 uVar10;
  btVector3 bVar11;
  long lVar12;
  btScalar depth_local;
  long local_138;
  long local_130;
  btCollisionObject *local_128;
  btVector3 *local_120;
  btVector3 pointA;
  btVector3 local_f0;
  btScalar local_e0 [4];
  btScalar local_d0;
  btScalar bStack_cc;
  btScalar bStack_c8;
  btScalar bStack_c4;
  btScalar local_c0 [2];
  btScalar abStack_b8 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  btScalar local_a0;
  undefined8 local_9c;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  undefined1 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined8 local_64;
  undefined8 uStack_5c;
  
  pbVar1 = ((this->super_btManifoldResult).m_manifoldPtr)->m_body0;
  pbVar2 = ((this->super_btManifoldResult).m_body0Wrap)->m_collisionObject;
  depth_local = depth;
  local_120 = normalOnBInWorld;
  local_f0 = operator*(normalOnBInWorld,&depth_local);
  pointA = operator+(pointInWorld,&local_f0);
  local_128 = pbVar1;
  if (pbVar1 == pbVar2) {
    bVar11 = btTransform::invXform
                       (&((this->super_btManifoldResult).m_body0Wrap)->m_collisionObject->
                         m_worldTransform,&pointA);
    uVar10 = bVar11.m_floats._8_8_;
    bVar8 = bVar11.m_floats[0];
    bVar9 = bVar11.m_floats[1];
    ppbVar7 = &(this->super_btManifoldResult).m_body1Wrap;
    local_130 = 0x20;
    local_138 = 0x24;
    lVar5 = 0x28;
    lVar12 = 0x2c;
  }
  else {
    ppbVar7 = &(this->super_btManifoldResult).m_body0Wrap;
    bVar11 = btTransform::invXform
                       (&((this->super_btManifoldResult).m_body1Wrap)->m_collisionObject->
                         m_worldTransform,&pointA);
    uVar10 = bVar11.m_floats._8_8_;
    bVar8 = bVar11.m_floats[0];
    bVar9 = bVar11.m_floats[1];
    local_130 = 0x24;
    local_138 = 0x20;
    lVar5 = 0x2c;
    lVar12 = 0x28;
  }
  local_e0 = (btScalar  [4])
             btTransform::invXform(&(*ppbVar7)->m_collisionObject->m_worldTransform,pointInWorld);
  bVar11 = pointA;
  local_f0.m_floats[1] = bVar9;
  local_f0.m_floats[0] = bVar8;
  local_f0.m_floats[2] = (btScalar)(int)uVar10;
  local_f0.m_floats[3] = (btScalar)((ulong)uVar10 >> 0x20);
  local_b0 = *(undefined8 *)local_120->m_floats;
  uStack_a8 = *(undefined8 *)(local_120->m_floats + 2);
  local_9c = 0;
  local_94 = 0;
  local_80 = 0;
  local_a0 = depth_local;
  local_78 = 0;
  local_64 = 0;
  uStack_5c = 0;
  local_74 = 0;
  uStack_6c = 0;
  local_c0[0] = pointA.m_floats[0];
  local_c0[1] = pointA.m_floats[1];
  abStack_b8[0] = pointA.m_floats[2];
  abStack_b8[1] = pointA.m_floats[3];
  local_d0 = pointInWorld->m_floats[0];
  bStack_cc = pointInWorld->m_floats[1];
  bStack_c8 = pointInWorld->m_floats[2];
  bStack_c4 = pointInWorld->m_floats[3];
  local_84 = *(undefined4 *)
              ((long)&(this->super_btManifoldResult).super_Result._vptr_Result + lVar12);
  local_88 = *(undefined4 *)
              ((long)&(this->super_btManifoldResult).super_Result._vptr_Result + lVar5);
  local_8c = *(undefined4 *)
              ((long)&(this->super_btManifoldResult).super_Result._vptr_Result + local_138);
  local_90 = *(undefined4 *)
              ((long)&(this->super_btManifoldResult).super_Result._vptr_Result + local_130);
  pbVar3 = (this->super_btManifoldResult).m_body0Wrap;
  pbVar4 = (this->super_btManifoldResult).m_body1Wrap;
  pbVar6 = pbVar3;
  if (local_128 == pbVar2) {
    pbVar6 = pbVar4;
    pbVar4 = pbVar3;
  }
  pointA = bVar11;
  (**(code **)(*(long *)this->m_resultCallback + 0x18))
            (this->m_resultCallback,&local_f0,pbVar4,local_90,local_88,pbVar6,local_8c,local_84);
  return;
}

Assistant:

virtual void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar depth)
	{
		bool isSwapped = m_manifoldPtr->getBody0() != m_body0Wrap->getCollisionObject();
		btVector3 pointA = pointInWorld + normalOnBInWorld * depth;
		btVector3 localA;
		btVector3 localB;
		if (isSwapped)
		{
			localA = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointA );
			localB = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
		} else
		{
			localA = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointA );
			localB = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
		}
		
		btManifoldPoint newPt(localA,localB,normalOnBInWorld,depth);
		newPt.m_positionWorldOnA = pointA;
		newPt.m_positionWorldOnB = pointInWorld;
		
	   //BP mod, store contact triangles.
		if (isSwapped)
		{
			newPt.m_partId0 = m_partId1;
			newPt.m_partId1 = m_partId0;
			newPt.m_index0  = m_index1;
			newPt.m_index1  = m_index0;
		} else
		{
			newPt.m_partId0 = m_partId0;
			newPt.m_partId1 = m_partId1;
			newPt.m_index0  = m_index0;
			newPt.m_index1  = m_index1;
		}

		//experimental feature info, for per-triangle material etc.
		const btCollisionObjectWrapper* obj0Wrap = isSwapped? m_body1Wrap : m_body0Wrap;
		const btCollisionObjectWrapper* obj1Wrap = isSwapped? m_body0Wrap : m_body1Wrap;
		m_resultCallback.addSingleResult(newPt,obj0Wrap,newPt.m_partId0,newPt.m_index0,obj1Wrap,newPt.m_partId1,newPt.m_index1);

	}